

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

uint64_t folder_uncompressed_size(_7z_folder *f)

{
  uint uVar1;
  uint i;
  uint pairs;
  int n;
  _7z_folder *f_local;
  
  n = (int)f->numOutStreams;
  uVar1 = (uint)f->numBindPairs;
  do {
    n = n + -1;
    if (n < 0) {
      return 0;
    }
    i = 0;
    while ((i < uVar1 && (f->bindPairs[i].outIndex != (long)n))) {
      i = i + 1;
    }
  } while (i < uVar1);
  return f->unPackSize[n];
}

Assistant:

static uint64_t
folder_uncompressed_size(struct _7z_folder *f)
{
	int n = (int)f->numOutStreams;
	unsigned pairs = (unsigned)f->numBindPairs;

	while (--n >= 0) {
		unsigned i;
		for (i = 0; i < pairs; i++) {
			if (f->bindPairs[i].outIndex == (uint64_t)n)
				break;
		}
		if (i >= pairs)
			return (f->unPackSize[n]);
	}
	return (0);
}